

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cc
# Opt level: O1

ostream * molly::operator<<(ostream *os,DeviceState *state)

{
  DeviceState DVar1;
  long lVar2;
  char *pcVar3;
  
  DVar1 = *state;
  if (DVar1 < LidClosed) {
    if (DVar1 != Unknown) {
      if (DVar1 != Unavailable) {
        return os;
      }
      pcVar3 = "Unavailable";
      lVar2 = 0xb;
      goto LAB_00102c71;
    }
    pcVar3 = "Unknown";
  }
  else {
    if (DVar1 == LidClosed) {
      pcVar3 = "LidClosed";
      lVar2 = 9;
      goto LAB_00102c71;
    }
    if (DVar1 == ButtonPressed) {
      pcVar3 = "ButtonPressed";
      lVar2 = 0xd;
      goto LAB_00102c71;
    }
    if (DVar1 != LidOpen) {
      return os;
    }
    pcVar3 = "LidOpen";
  }
  lVar2 = 7;
LAB_00102c71:
  std::__ostream_insert<char,std::char_traits<char>>(os,pcVar3,lVar2);
  return os;
}

Assistant:

std::ostream& molly::operator<<(std::ostream& os, DeviceState const& state)
{
  switch (state)
  {
    case DeviceState::Unknown:       os << "Unknown";       break;
    case DeviceState::Unavailable:   os << "Unavailable";   break;
    case DeviceState::LidClosed:     os << "LidClosed";     break;
    case DeviceState::ButtonPressed: os << "ButtonPressed"; break;
    case DeviceState::LidOpen:       os << "LidOpen";       break;
  }
  return os;
}